

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# innerproduct_x86.cpp
# Opt level: O0

int __thiscall ncnn::InnerProduct_x86::create_pipeline(InnerProduct_x86 *this,Option *opt)

{
  int iVar1;
  Layer *pLVar2;
  float *pfVar3;
  long in_RSI;
  long *in_RDI;
  int j;
  int p;
  float *g0;
  int q;
  Mat weight_data_r2;
  int out_elempack;
  int num_input;
  ParamDict pd;
  ParamDict *in_stack_ffffffffffffff40;
  undefined8 in_stack_ffffffffffffff48;
  undefined1 *puVar4;
  undefined4 in_stack_ffffffffffffff60;
  int iVar5;
  undefined4 in_stack_ffffffffffffff64;
  int iVar6;
  float *local_98;
  int local_8c;
  Allocator *in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  Mat *in_stack_ffffffffffffff88;
  int local_3c;
  undefined4 in_stack_ffffffffffffffc8;
  undefined4 in_stack_ffffffffffffffcc;
  InnerProduct_x86 *in_stack_ffffffffffffffd0;
  undefined1 local_28 [16];
  long local_18;
  int local_4;
  
  local_18 = in_RSI;
  pLVar2 = create_layer((int)((ulong)in_stack_ffffffffffffff48 >> 0x20));
  in_RDI[1] = (long)pLVar2;
  puVar4 = local_28;
  ParamDict::ParamDict((ParamDict *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60));
  (**(code **)(*(long *)in_RDI[1] + 0x10))((long *)in_RDI[1],puVar4);
  (**(code **)(*(long *)in_RDI[1] + 0x20))((long *)in_RDI[1],local_18);
  ParamDict::~ParamDict(in_stack_ffffffffffffff40);
  if (((*(byte *)(local_18 + 0x1e) & 1) == 0) ||
     (*(long *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0x140) != 1)) {
    iVar1 = *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd8) /
            *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
    local_3c = 1;
    if (((*(byte *)(local_18 + 0x27) & 1) != 0) &&
       (local_3c = 1, *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0) % 4 == 0)) {
      local_3c = 4;
    }
    if (local_3c != 1) {
      iVar6 = 0;
      ncnn::Mat::reshape(in_stack_ffffffffffffff88,in_stack_ffffffffffffff84,
                         in_stack_ffffffffffffff80,in_stack_ffffffffffffff78);
      ncnn::Mat::create((Mat *)CONCAT44(in_stack_ffffffffffffff64,in_stack_ffffffffffffff60),
                        (int)((ulong)puVar4 >> 0x20),(int)puVar4,(size_t)in_RDI,iVar6,
                        (Allocator *)in_stack_ffffffffffffff40);
      for (local_8c = 0;
          local_8c + local_3c + -1 < *(int *)((long)in_RDI + *(long *)(*in_RDI + -0x18) + 0xd0);
          local_8c = local_3c + local_8c) {
        local_98 = ncnn::Mat::row((Mat *)(in_RDI + 3),local_8c / local_3c);
        for (iVar6 = 0; iVar6 < iVar1; iVar6 = iVar6 + 1) {
          for (iVar5 = 0; iVar5 < local_3c; iVar5 = iVar5 + 1) {
            pfVar3 = ncnn::Mat::row((Mat *)&stack0xffffffffffffff78,local_8c + iVar5);
            *local_98 = pfVar3[iVar6];
            local_98 = local_98 + 1;
          }
        }
      }
      ncnn::Mat::~Mat((Mat *)0x39538b);
    }
    local_4 = 0;
  }
  else {
    local_4 = create_pipeline_int8_x86
                        (in_stack_ffffffffffffffd0,
                         (Option *)CONCAT44(in_stack_ffffffffffffffcc,in_stack_ffffffffffffffc8));
  }
  return local_4;
}

Assistant:

int InnerProduct_x86::create_pipeline(const Option& opt)
{
    //     if (opt.use_packing_layout)
    {
        flatten = ncnn::create_layer(ncnn::LayerType::Flatten);

        ncnn::ParamDict pd;

        flatten->load_param(pd);

        flatten->create_pipeline(opt);
    }

#if NCNN_INT8
    if (opt.use_int8_inference && weight_data.elemsize == (size_t)1u)
    {
        return create_pipeline_int8_x86(opt);
    }
#endif

    const int num_input = weight_data_size / num_output;

    int out_elempack = 1;

#if __SSE2__
    if (opt.use_packing_layout)
    {
#if __AVX__
        out_elempack = num_output % 8 == 0 ? 8 : num_output % 4 == 0 ? 4 : 1;
#else
        out_elempack = num_output % 4 == 0 ? 4 : 1;
#endif
    }
#endif // __SSE2__

    if (out_elempack != 1)
    {
        // src = inch-outch
        // dst = pb-inch-outch/pb
        {
            Mat weight_data_r2 = weight_data.reshape(num_input, num_output);

            weight_data_packed.create(num_input, num_output / out_elempack, (size_t)4u * out_elempack, out_elempack);

            for (int q = 0; q + (out_elempack - 1) < num_output; q += out_elempack)
            {
                float* g0 = weight_data_packed.row(q / out_elempack);

                for (int p = 0; p < num_input; p++)
                {
                    for (int j = 0; j < out_elempack; j++)
                    {
                        *g0++ = weight_data_r2.row(q + j)[p];
                    }
                }
            }
        }
    }

#if __AVX2__
    if (opt.use_weight_fp16_storage && weight_data.elemsize == 4u)
    {
        ncnn::cast_float32_to_float16(weight_data, weight_data_fp16, opt);

        return 0;
    }
#endif

    return 0;
}